

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_vbpermd_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  long lVar1;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  ulong uStack_18;
  ppc_avr_t result;
  
  uStack_18 = 0;
  result.u64[0] = 0;
  pbVar3 = b->u8 + 7;
  lVar1 = 1;
  do {
    lVar2 = 0;
    pbVar4 = pbVar3;
    do {
      if ((*pbVar4 < 0x40) &&
         ((a->u64[1 - lVar1] >> ((ulong)(byte)(0x3f - *pbVar4) & 0x3f) & 1) != 0)) {
        (&uStack_18)[1 - lVar1] = (&uStack_18)[1 - lVar1] | (ulong)(0x80 >> ((byte)lVar2 & 0x1f));
      }
      lVar2 = lVar2 + 1;
      pbVar4 = pbVar4 + -1;
    } while (lVar2 != 8);
    pbVar3 = pbVar3 + 8;
    bVar5 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar5);
  r->u64[0] = uStack_18;
  r->u64[1] = result.u64[0];
  return;
}

Assistant:

void helper_vbpermd(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    int i, j;
    ppc_avr_t result = { .u64 = { 0, 0 } };
    VECTOR_FOR_INORDER_I(i, u64) {
        for (j = 0; j < 8; j++) {
            int index = VBPERMQ_INDEX(b, (i * 8) + j);
            if (index < 64 && EXTRACT_BIT(a, i, index)) {
                result.u64[VBPERMD_INDEX(i)] |= (0x80 >> j);
            }
        }
    }
    *r = result;
}